

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffx.c
# Opt level: O0

void ffx_encrypt(ptls_cipher_context_t *_ctx,void *output,void *input,size_t len)

{
  byte bVar1;
  int local_a4;
  int local_a0;
  int i_1;
  int i;
  uint8_t last_byte;
  uint8_t iv [16];
  uint8_t confusion [32];
  uint8_t right [16];
  uint8_t left [16];
  ptls_ffx_context_t *ctx;
  size_t len_local;
  void *input_local;
  void *output_local;
  ptls_cipher_context_t *_ctx_local;
  
  if (_ctx->do_transform != ffx_encrypt) {
    __assert_fail("ctx->super.do_transform == ffx_encrypt",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c",
                  0x90,"void ffx_encrypt(ptls_cipher_context_t *, void *, const void *, size_t)");
  }
  if ((_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)len != _ctx[1].do_init) {
    __assert_fail("len == ctx->byte_length",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c",
                  0x93,"void ffx_encrypt(ptls_cipher_context_t *, void *, const void *, size_t)");
  }
  if ((_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)len == _ctx[1].do_init) {
    memcpy(right + 8,input,(size_t)_ctx[1].do_transform);
    memcpy(confusion + 0x18,
           (_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)
           ((long)input + (long)_ctx[1].do_transform),(size_t)_ctx[2].algo);
    memset(right + 8 + (long)_ctx[1].do_transform,0,0x10 - (long)_ctx[1].do_transform);
    memset(confusion + (long)&(_ctx[2].algo)->iv_size,0,0x10 - (long)_ctx[2].algo);
    bVar1 = confusion[(long)((long)&(_ctx[2].algo)->block_size + 7)];
    confusion[(long)((long)&(_ctx[2].algo)->block_size + 7)] =
         confusion[(long)((long)&(_ctx[2].algo)->block_size + 7)] & *(byte *)&_ctx[2].do_dispose;
    if (*(int *)((long)&_ctx[1].do_dispose + 4) == 0) {
      for (local_a4 = 0; local_a4 < *(int *)&_ctx[1].do_dispose; local_a4 = local_a4 + 2) {
        ptls_ffx_one_pass((ptls_cipher_context_t *)_ctx[1].algo,right + 8,
                          (size_t)_ctx[1].do_transform,confusion + 0x18,(size_t)_ctx[2].algo,
                          *(uint8_t *)&_ctx[2].do_dispose,iv + 8,(uint8_t *)&i,
                          (uint8_t *)((long)&_ctx[2].do_dispose + 1),
                          ((char)*(undefined4 *)&_ctx[1].do_dispose + -1) - (char)local_a4,
                          (uint8_t)*(undefined4 *)&_ctx[1].do_dispose);
        ptls_ffx_one_pass((ptls_cipher_context_t *)_ctx[1].algo,confusion + 0x18,
                          (size_t)_ctx[2].algo,right + 8,(size_t)_ctx[1].do_transform,0xff,iv + 8,
                          (uint8_t *)&i,(uint8_t *)((long)&_ctx[2].do_dispose + 1),
                          ((char)*(undefined4 *)&_ctx[1].do_dispose + -2) - (char)local_a4,
                          (uint8_t)*(undefined4 *)&_ctx[1].do_dispose);
      }
    }
    else {
      for (local_a0 = 0; local_a0 < *(int *)&_ctx[1].do_dispose; local_a0 = local_a0 + 2) {
        ptls_ffx_one_pass((ptls_cipher_context_t *)_ctx[1].algo,confusion + 0x18,
                          (size_t)_ctx[2].algo,right + 8,(size_t)_ctx[1].do_transform,0xff,iv + 8,
                          (uint8_t *)&i,(uint8_t *)((long)&_ctx[2].do_dispose + 1),(uint8_t)local_a0
                          ,(uint8_t)*(undefined4 *)&_ctx[1].do_dispose);
        ptls_ffx_one_pass((ptls_cipher_context_t *)_ctx[1].algo,right + 8,
                          (size_t)_ctx[1].do_transform,confusion + 0x18,(size_t)_ctx[2].algo,
                          *(uint8_t *)&_ctx[2].do_dispose,iv + 8,(uint8_t *)&i,
                          (uint8_t *)((long)&_ctx[2].do_dispose + 1),(uint8_t)local_a0 + '\x01',
                          (uint8_t)*(undefined4 *)&_ctx[1].do_dispose);
      }
    }
    memcpy(output,right + 8,(size_t)_ctx[1].do_transform);
    confusion[(long)((long)&(_ctx[2].algo)->block_size + 7)] =
         confusion[(long)((long)&(_ctx[2].algo)->block_size + 7)] & *(byte *)&_ctx[2].do_dispose;
    confusion[(long)((long)&(_ctx[2].algo)->block_size + 7)] =
         confusion[(long)((long)&(_ctx[2].algo)->block_size + 7)] |
         bVar1 & (*(byte *)&_ctx[2].do_dispose ^ 0xff);
    memcpy((_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)
           ((long)output + (long)_ctx[1].do_transform),confusion + 0x18,(size_t)_ctx[2].algo);
    (*ptls_clear_memory)(right + 8,0x10);
    (*ptls_clear_memory)(confusion + 0x18,0x10);
    (*ptls_clear_memory)(iv + 8,0x20);
  }
  else {
    memset(output,0,len);
  }
  return;
}

Assistant:

static void ffx_encrypt(ptls_cipher_context_t *_ctx, void *output, const void *input, size_t len)
{
    ptls_ffx_context_t *ctx = (ptls_ffx_context_t *)_ctx;
    uint8_t left[16], right[16], confusion[32], iv[16];
    uint8_t last_byte;

    assert(ctx->super.do_transform == ffx_encrypt);

    /* len must match context definition */
    assert(len == ctx->byte_length);
    if (len != ctx->byte_length) {
        memset(output, 0, len); /* so that we do not leak anything in production mode */
        return;
    }

    /* Split the input in two halves */
    memcpy(left, input, ctx->nb_left);
    memcpy(right, ((uint8_t *)input) + ctx->nb_left, ctx->nb_right);
    memset(left + ctx->nb_left, 0, 16 - ctx->nb_left);
    memset(right + ctx->nb_right, 0, 16 - ctx->nb_right);
    last_byte = right[ctx->nb_right - 1];
    right[ctx->nb_right - 1] &= ctx->mask_last_byte;

    if (ctx->is_enc) {
        /* Feistel construct, using the specified algorithm as S-Box */
        for (int i = 0; i < ctx->nb_rounds; i += 2) {
            /* Each pass encrypts a zero field with a cipher using one
             * half of the message as IV. This construct lets us use
             * either AES or chacha 20 */
            ptls_ffx_one_pass(ctx->enc_ctx, right, ctx->nb_right, left, ctx->nb_left, 0xFF, confusion, iv, ctx->tweaks, i,
                              ctx->nb_rounds);
            ptls_ffx_one_pass(ctx->enc_ctx, left, ctx->nb_left, right, ctx->nb_right, ctx->mask_last_byte, confusion, iv,
                              ctx->tweaks, i + 1, ctx->nb_rounds);
        }
    } else {
        /* Feistel construct, using the specified algorithm as S-Box,
         * in the opposite order of the encryption */

        for (int i = 0; i < ctx->nb_rounds; i += 2) {
            /* Each pass encrypts a zero field with a cipher using one
             * half of the message as IV. This construct lets us use
             * either AES or chacha 20 */

            ptls_ffx_one_pass(ctx->enc_ctx, left, ctx->nb_left, right, ctx->nb_right, ctx->mask_last_byte, confusion, iv,
                              ctx->tweaks, ctx->nb_rounds - 1 - i, ctx->nb_rounds);
            ptls_ffx_one_pass(ctx->enc_ctx, right, ctx->nb_right, left, ctx->nb_left, 0xFF, confusion, iv, ctx->tweaks,
                              ctx->nb_rounds - 2 - i, ctx->nb_rounds);
        }
    }
    /* After enough passes, we have a very strong length preserving
     * encryption, only that many times slower than the underlying
     * algorithm. We copy the result to the output */
    memcpy(output, left, ctx->nb_left);

    right[ctx->nb_right - 1] &= ctx->mask_last_byte;
    right[ctx->nb_right - 1] |= (last_byte & ~ctx->mask_last_byte);

    memcpy(((uint8_t *)output) + ctx->nb_left, right, ctx->nb_right);

    ptls_clear_memory(left, sizeof(left));
    ptls_clear_memory(right, sizeof(right));
    ptls_clear_memory(confusion, sizeof(confusion));
}